

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall higan::Channel::~Channel(Channel *this)

{
  Channel *this_local;
  
  std::function<void_()>::~function(&this->readable_callback_);
  std::function<void_()>::~function(&this->writable_callback_);
  std::function<void_()>::~function(&this->error_callback_);
  std::__cxx11::string::~string((string *)&this->connection_name_);
  return;
}

Assistant:

Channel::~Channel()
{

}